

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledInputFile.cpp
# Opt level: O1

void __thiscall
Imf_3_4::TiledInputFile::setFrameBuffer(TiledInputFile *this,FrameBuffer *frameBuffer)

{
  pointer *ppSVar1;
  Slice *__args;
  element_type *peVar2;
  pointer pSVar3;
  iterator __position;
  _Base_ptr p_Var4;
  _Base_ptr p_Var5;
  _Base_ptr p_Var6;
  _Base_ptr p_Var7;
  undefined4 uVar8;
  PixelType PVar9;
  undefined4 uVar10;
  int iVar11;
  const_iterator cVar12;
  ConstIterator CVar13;
  exr_attr_chlist_entry_t *peVar14;
  ostream *poVar15;
  char *pcVar16;
  ArgExc *this_00;
  mutex *__mutex;
  stringstream _iex_throw_s;
  stringstream local_1b0 [16];
  ostream local_1a0 [376];
  
  __mutex = &((this->_data).
              super___shared_ptr<Imf_3_4::TiledInputFile::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
             ->_mx;
  iVar11 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar11 != 0) {
    std::__throw_system_error(iVar11);
  }
  peVar2 = (this->_data).
           super___shared_ptr<Imf_3_4::TiledInputFile::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  pSVar3 = (peVar2->fill_list).super__Vector_base<Imf_3_4::Slice,_std::allocator<Imf_3_4::Slice>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((peVar2->fill_list).super__Vector_base<Imf_3_4::Slice,_std::allocator<Imf_3_4::Slice>_>.
      _M_impl.super__Vector_impl_data._M_finish != pSVar3) {
    (peVar2->fill_list).super__Vector_base<Imf_3_4::Slice,_std::allocator<Imf_3_4::Slice>_>._M_impl.
    super__Vector_impl_data._M_finish = pSVar3;
  }
  cVar12._M_node = (_Base_ptr)FrameBuffer::begin(frameBuffer);
  do {
    CVar13 = FrameBuffer::end(frameBuffer);
    peVar2 = (this->_data).
             super___shared_ptr<Imf_3_4::TiledInputFile::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((const_iterator)cVar12._M_node == CVar13._i._M_node) {
      std::
      _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
      ::operator=((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
                   *)&peVar2->frameBuffer,
                  (_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
                   *)frameBuffer);
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      return;
    }
    peVar14 = Context::findChannel(&this->_ctxt,peVar2->partNumber,(char *)(cVar12._M_node + 1));
    if (peVar14 == (exr_attr_chlist_entry_t *)0x0) {
      peVar2 = (this->_data).
               super___shared_ptr<Imf_3_4::TiledInputFile::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      __args = (Slice *)(cVar12._M_node + 9);
      __position._M_current =
           (peVar2->fill_list).super__Vector_base<Imf_3_4::Slice,_std::allocator<Imf_3_4::Slice>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (peVar2->fill_list).super__Vector_base<Imf_3_4::Slice,_std::allocator<Imf_3_4::Slice>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<Imf_3_4::Slice,std::allocator<Imf_3_4::Slice>>::
        _M_realloc_insert<Imf_3_4::Slice_const&>
                  ((vector<Imf_3_4::Slice,std::allocator<Imf_3_4::Slice>> *)&peVar2->fill_list,
                   __position,__args);
      }
      else {
        *(_Base_ptr *)&(__position._M_current)->xTileCoords = cVar12._M_node[10]._M_left;
        PVar9 = __args->type;
        uVar10 = *(undefined4 *)&__args->field_0x4;
        p_Var4 = cVar12._M_node[9]._M_parent;
        p_Var5 = cVar12._M_node[9]._M_left;
        p_Var6 = cVar12._M_node[9]._M_right;
        uVar8 = *(undefined4 *)&cVar12._M_node[10].field_0x4;
        p_Var7 = cVar12._M_node[10]._M_parent;
        (__position._M_current)->xSampling = cVar12._M_node[10]._M_color;
        (__position._M_current)->ySampling = uVar8;
        (__position._M_current)->fillValue = (double)p_Var7;
        (__position._M_current)->xStride = (size_t)p_Var5;
        (__position._M_current)->yStride = (size_t)p_Var6;
        (__position._M_current)->type = PVar9;
        *(undefined4 *)&(__position._M_current)->field_0x4 = uVar10;
        (__position._M_current)->base = (char *)p_Var4;
        ppSVar1 = &(peVar2->fill_list).
                   super__Vector_base<Imf_3_4::Slice,_std::allocator<Imf_3_4::Slice>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        *ppSVar1 = *ppSVar1 + 1;
      }
    }
    else if ((peVar14->x_sampling != cVar12._M_node[10]._M_color) ||
            (peVar14->y_sampling != *(int *)&cVar12._M_node[10].field_0x4)) {
      iex_debugTrap();
      std::__cxx11::stringstream::stringstream(local_1b0);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_1a0,"X and/or y subsampling factors of \"",0x23);
      poVar15 = std::operator<<(local_1a0,(char *)(cVar12._M_node + 1));
      std::__ostream_insert<char,std::char_traits<char>>(poVar15,"\" channel of input file \"",0x19)
      ;
      pcVar16 = Context::fileName(&this->_ctxt);
      poVar15 = std::operator<<(poVar15,pcVar16);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar15,"\" are not compatible with the frame buffer\'s subsampling factors.",0x41)
      ;
      this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
      Iex_3_4::ArgExc::ArgExc(this_00,local_1b0);
      __cxa_throw(this_00,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
    }
    cVar12._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar12._M_node);
  } while( true );
}

Assistant:

void
TiledInputFile::setFrameBuffer (const FrameBuffer& frameBuffer)
{
#if ILMTHREAD_THREADING_ENABLED
    std::lock_guard<std::mutex> lock (_data->_mx);
#endif
    _data->fill_list.clear ();

    for (FrameBuffer::ConstIterator j = frameBuffer.begin ();
         j != frameBuffer.end ();
         ++j)
    {
        const exr_attr_chlist_entry_t* curc = _ctxt.findChannel (
            _data->partNumber, j.name ());

        if (!curc)
        {
            _data->fill_list.push_back (j.slice ());
            continue;
        }

        if (curc->x_sampling != j.slice ().xSampling ||
            curc->y_sampling != j.slice ().ySampling)
            THROW (
                IEX_NAMESPACE::ArgExc,
                "X and/or y subsampling factors "
                "of \""
                    << j.name ()
                    << "\" channel "
                       "of input file \""
                    << fileName ()
                    << "\" are "
                       "not compatible with the frame buffer's "
                       "subsampling factors.");
    }

    _data->frameBuffer = frameBuffer;
}